

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O3

Str * __thiscall
mbc::Val::MessageBook::fullID(Str *__return_storage_ptr__,MessageBook *this,Str *ID)

{
  pointer pcVar1;
  Str *this_00;
  bool bVar2;
  string *psVar3;
  undefined8 *puVar4;
  _List_node_base *p_Var5;
  string local_80;
  string local_60;
  Str *local_40;
  Str *local_38;
  
  p_Var5 = (_List_node_base *)this->order_;
  local_40 = ID;
  local_38 = __return_storage_ptr__;
  do {
    p_Var5 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)this->order_) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &PTR__exception_0013f740;
      __cxa_throw(puVar4,&bad_ID::typeinfo,std::exception::~exception);
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,p_Var5[1]._M_next,
               (long)&(p_Var5[1]._M_prev)->_M_next + (long)p_Var5[1]._M_next);
    psVar3 = Str::raw_abi_cxx11_(local_40);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + psVar3->_M_string_length);
    bVar2 = units::start_with(&local_80,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    this_00 = local_38;
  } while (!bVar2);
  Str::Str(local_38);
  _ValAtom::set(&this_00->super__ValAtom,(string *)(p_Var5 + 1));
  return this_00;
}

Assistant:

Str MessageBook::fullID(Str ID) {
    for(auto it = order_ -> begin(); it != order_ -> end(); ++it) {
        if (units::start_with(*it, ID.raw())) {
            Str result;
            result.set(*it);
            return result;
        }
    }
    throw bad_ID();
}